

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyBinaryStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort **ppuVar4;
  ushort *puVar5;
  int iVar6;
  ushort *puVar7;
  ushort *puVar8;
  ushort *puVar9;
  bool bVar10;
  
  puVar9 = (ushort *)(zSrc + nLen);
  for (; zSrc < puVar9; zSrc = (char *)((long)zSrc + 1)) {
    ppuVar4 = __ctype_b_loc();
    bVar2 = (byte)*(ushort *)zSrc;
    if ((*(byte *)((long)*ppuVar4 + (long)(char)bVar2 * 2 + 1) & 0x20) == 0) {
      if ((bVar2 == 0x2b) || (bVar2 == 0x2d)) {
        bVar10 = bVar2 == 0x2d;
        zSrc = (char *)((long)zSrc + 1);
        goto LAB_001198c7;
      }
      break;
    }
  }
  bVar10 = false;
LAB_001198c7:
  if (((zSrc < puVar9 + -1) && ((byte)*(ushort *)zSrc == 0x30)) &&
     ((*(byte *)((long)zSrc + 1) | 0x20) == 0x62)) {
    zSrc = (char *)((long)zSrc + 2);
  }
  for (; (zSrc < puVar9 && ((byte)*(ushort *)zSrc == 0x30)); zSrc = (char *)((long)zSrc + 1)) {
  }
  puVar5 = (ushort *)((long)zSrc + 1);
  iVar6 = 3;
  puVar7 = (ushort *)0x0;
  while( true ) {
    puVar1 = (ushort *)((long)puVar5 - 1);
    puVar8 = puVar1;
    if ((puVar9 <= puVar1) || (puVar8 = (ushort *)zSrc, ((byte)*puVar1 & 0xfe) != 0x30))
    goto LAB_001199b7;
    puVar7 = (ushort *)((ulong)(byte)*puVar1 + (long)puVar7 * 2 + -0x30);
    if (puVar9 <= puVar5) break;
    puVar8 = puVar5;
    if (((byte)*puVar5 & 0xfe) != 0x30) goto LAB_001199b7;
    puVar7 = (ushort *)((ulong)(byte)*puVar5 + (long)puVar7 * 2 + -0x30);
    puVar8 = (ushort *)((long)puVar5 + 1);
    if (puVar9 <= puVar8) goto LAB_001199b7;
    if ((*(byte *)puVar8 & 0xfe) != 0x30) {
      puVar8 = (ushort *)((long)zSrc + 2);
      goto LAB_001199b7;
    }
    puVar7 = (ushort *)((ulong)*(byte *)puVar8 + (long)puVar7 * 2 + -0x30);
    puVar8 = puVar5 + 1;
    if (puVar9 <= puVar8) {
      puVar8 = (ushort *)((long)zSrc + 3);
      goto LAB_001199b7;
    }
    if ((0x3e < iVar6) || (((byte)*puVar8 & 0xfe) != 0x30)) goto LAB_001199b7;
    puVar7 = (ushort *)((ulong)(byte)*puVar8 + (long)puVar7 * 2 + -0x30);
    zSrc = (char *)((long)zSrc + 4);
    puVar5 = puVar5 + 2;
    iVar6 = iVar6 + 4;
  }
  puVar8 = (ushort *)((long)zSrc + 1);
LAB_001199b7:
  do {
    if (puVar9 <= puVar8) break;
    ppuVar4 = __ctype_b_loc();
    puVar5 = *ppuVar4;
    uVar3 = *puVar8;
    puVar8 = (ushort *)((long)puVar8 + 1);
  } while ((*(byte *)((long)puVar5 + (long)(char)(byte)uVar3 * 2 + 1) & 0x20) != 0);
  if (pOutVal != (void *)0x0) {
    puVar5 = (ushort *)-(long)puVar7;
    if (puVar7 == (ushort *)0x0) {
      puVar5 = puVar7;
    }
    if (!bVar10) {
      puVar5 = puVar7;
    }
    *(ushort **)pOutVal = puVar5;
  }
  return (sxi32)puVar5;
}

Assistant:

JX9_PRIVATE sxi32 SyBinaryStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
	int c;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	if( zSrc < &zEnd[-2] && zSrc[0] == '0' && (zSrc[1] == 'b' || zSrc[1] == 'B') ){
		/* Bypass binary prefix */
		zSrc += sizeof(char) * 2;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}